

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone::save_data(xr_bone *this,xr_writer *w)

{
  undefined8 uVar1;
  long lVar2;
  anon_union_8_3_f28016de_for__vector2<float>_1 local_3c;
  undefined4 local_34;
  
  xr_writer::w_chunk(w,2,&this->m_name);
  xr_writer::w_chunk(w,4,&this->m_gamemtl);
  xr_writer::w_chunk<xray_re::s_bone_shape>(w,5,&this->m_shape);
  xr_writer::w_chunk<unsigned_int>(w,8,&(this->m_joint_ik_data).ik_flags);
  xr_writer::open_chunk(w,6);
  local_3c.field_0.x = (float)(this->m_joint_ik_data).type;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x10) {
    uVar1 = *(undefined8 *)((long)&(this->m_joint_ik_data).limits[0].limit.field_0 + lVar2);
    local_3c.field_0.y = -(float)uVar1;
    local_3c.field_0.x = -(float)((ulong)uVar1 >> 0x20);
    xr_writer::w_fvector2(w,(fvector2 *)&local_3c.field_0);
    local_34 = *(undefined4 *)((long)&(this->m_joint_ik_data).limits[0].spring_factor + lVar2);
    (*w->_vptr_xr_writer[2])(w,&local_34,4);
    local_34 = *(undefined4 *)((long)&(this->m_joint_ik_data).limits[0].damping_factor + lVar2);
    (*w->_vptr_xr_writer[2])(w,&local_34,4);
  }
  local_3c.field_0.x = (this->m_joint_ik_data).spring_factor;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c.field_0.x = (this->m_joint_ik_data).damping_factor;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,9);
  local_3c.field_0.x = (this->m_joint_ik_data).break_force;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  local_3c.field_0.x = (this->m_joint_ik_data).break_torque;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<float>(w,0x10,&(this->m_joint_ik_data).friction);
  xr_writer::open_chunk(w,7);
  local_3c.field_0.x = this->m_mass;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::w_fvector3(w,&this->m_center_of_mass);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_bone::save_data(xr_writer& w) const
{
	w.w_chunk(BONE_CHUNK_DEF, m_name);	// second type!!!
	w.w_chunk(BONE_CHUNK_MATERIAL, m_gamemtl);
	w.w_chunk<s_bone_shape>(BONE_CHUNK_SHAPE, m_shape);
	w.w_chunk<uint32_t>(BONE_CHUNK_IK_FLAGS, m_joint_ik_data.ik_flags);

	w.open_chunk(BONE_CHUNK_IK_JOINT);
	w.w_u32(m_joint_ik_data.type);

	//w.w_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	for (int i = 0; i < 3; ++i) //invert limits for AE
	{
		fvector2 vec = m_joint_ik_data.limits[i].limit;
		float tmp = vec.x;
		vec.x = -vec.y;
		vec.y = -tmp;
		w.w_fvector2(vec);
		w.w_float(m_joint_ik_data.limits[i].spring_factor);
		w.w_float(m_joint_ik_data.limits[i].damping_factor);
	}

	w.w_float(m_joint_ik_data.spring_factor);
	w.w_float(m_joint_ik_data.damping_factor);
	w.close_chunk();

	w.open_chunk(BONE_CHUNK_BREAK_PARAMS);
	w.w_float(m_joint_ik_data.break_force);
	w.w_float(m_joint_ik_data.break_torque);
	w.close_chunk();

	w.w_chunk<float>(BONE_CHUNK_FRICTION, m_joint_ik_data.friction);

	w.open_chunk(BONE_CHUNK_MASS_PARAMS);
	w.w_float(m_mass);
	w.w_fvector3(m_center_of_mass);
	w.close_chunk();
}